

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O2

int ulp_encrypt(uint8_t *msg,ulp_public_key *pub_key,ulp_ciphertext **ciphertext_p)

{
  size_t count;
  int iVar1;
  int iVar2;
  int iVar3;
  ulp_ciphertext *ciphertext;
  uint64_t *buffer;
  uint64_t *out;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  long lVar7;
  size_t j;
  ulong uVar8;
  size_t j_1;
  ulong uVar9;
  size_t i;
  ulong uVar10;
  
  if (pub_key != (ulp_public_key *)0x0 && msg != (uint8_t *)0x0) {
    ciphertext = ulp_alloc_ciphertext(pub_key->n,pub_key->l);
    count = pub_key->n;
    buffer = (uint64_t *)malloc(count * 8);
    out = (uint64_t *)malloc(pub_key->l << 3);
    if (out != (uint64_t *)0x0 && (buffer != (uint64_t *)0x0 && ciphertext != (ulp_ciphertext *)0x0)
       ) {
      iVar1 = get_random_numbers(buffer,count,pub_key->se);
      iVar2 = get_random_numbers(ciphertext->c1,pub_key->n,pub_key->se);
      iVar3 = get_random_numbers(ciphertext->c2,pub_key->l,pub_key->se);
      if (iVar3 + iVar2 + iVar1 == 0) {
        encode(msg,out,pub_key->l,pub_key->q);
        uVar10 = pub_key->n;
        lVar7 = 0;
        for (uVar6 = 0; uVar8 = 0, uVar6 < uVar10; uVar6 = uVar6 + 1) {
          for (; uVar8 < uVar10; uVar8 = uVar8 + 1) {
            uVar5 = ciphertext->c1[uVar6];
            uVar4 = mulmod(*(uint64_t *)((long)pub_key->A + uVar8 * 8 + uVar10 * lVar7),
                           buffer[uVar8],pub_key->q);
            ciphertext->c1[uVar6] = (uVar4 + uVar5) % pub_key->q;
            uVar10 = pub_key->n;
          }
          lVar7 = lVar7 + 8;
        }
        for (uVar10 = 0; uVar10 < pub_key->l; uVar10 = uVar10 + 1) {
          uVar6 = (out[uVar10] + ciphertext->c2[uVar10]) % pub_key->q;
          ciphertext->c2[uVar10] = uVar6;
          for (uVar9 = 0; uVar9 < pub_key->n; uVar9 = uVar9 + 1) {
            uVar5 = mulmod(*(uint64_t *)((long)pub_key->P + uVar9 * 8 + pub_key->n * uVar8),
                           buffer[uVar9],pub_key->q);
            uVar6 = (uVar5 + uVar6) % pub_key->q;
            ciphertext->c2[uVar10] = uVar6;
          }
          uVar8 = uVar8 + 8;
        }
        free(buffer);
        free(out);
        *ciphertext_p = ciphertext;
        return 0;
      }
    }
    ulp_free_ciphertext(ciphertext);
    free(buffer);
    free(out);
  }
  return -1;
}

Assistant:

int ulp_encrypt(uint8_t msg[], ulp_public_key* pub_key, ulp_ciphertext** ciphertext_p) {

    if(msg == NULL || pub_key == NULL)
        return -1;

    // allocate memory for ciphertext and other buffers
    ulp_ciphertext* ciphertext = ulp_alloc_ciphertext(pub_key->n, pub_key->l);
    uint64_t* e1 = malloc(pub_key->n * sizeof(pub_key->se));
    uint64_t* encoded = malloc(pub_key->l * sizeof(pub_key->q));
    if(ciphertext == NULL || e1 == NULL || encoded == NULL)
        goto fail;

    // gather random data for e1, e2 and e3
    int err = 0;
    err += get_random_numbers(e1, pub_key->n, pub_key->se);
    err += get_random_numbers(ciphertext->c1, pub_key->n, pub_key->se);
    err += get_random_numbers(ciphertext->c2, pub_key->l, pub_key->se);
    if(err != 0)
        goto fail;

    // encode input
    encode(msg, encoded, pub_key->l, pub_key->q);

    // c1 = A*e1 + e2
    for(size_t i = 0; i < pub_key->n; i++) {
        for(size_t j = 0; j < pub_key->n; j++) {
            ciphertext->c1[i] = (ciphertext->c1[i] + mulmod(pub_key->A[i*pub_key->n + j], e1[j], pub_key->q)) % pub_key->q;
        }
    }

    // c2 = P*e1 + e3 + encoded(msg)
    for(size_t i = 0; i < pub_key->l; i++) {
        ciphertext->c2[i] = (ciphertext->c2[i] + encoded[i]) % pub_key->q;
        for(size_t j = 0; j < pub_key->n; j++) {
            ciphertext->c2[i] = (ciphertext->c2[i] + mulmod(pub_key->P[i*pub_key->n + j], e1[j], pub_key->q)) % pub_key->q;
        }
    }

    // exit properly
    free(e1);
    free(encoded);
    *ciphertext_p = ciphertext;
    return 0;


    fail:
        ulp_free_ciphertext(ciphertext);
        free(e1);
        free(encoded);
        return -1;

}